

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::PointTestInstance::iterate
          (TestStatus *__return_storage_ptr__,PointTestInstance *this)

{
  deUint32 width;
  int iVar1;
  TestContext *pTVar2;
  TestLog *pTVar3;
  TextureFormat *format;
  int *piVar4;
  MessageBuilder *pMVar5;
  float extraout_XMM0_Da;
  allocator<char> local_331;
  string local_330;
  undefined4 local_310;
  allocator<char> local_309;
  string local_308;
  MessageBuilder local_2e8;
  undefined1 local_168 [8];
  IVec4 colorBits;
  PointSceneSpec scene;
  RasterizationArguments args;
  bool compareOk;
  vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_> points;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  float pointSize;
  ScopedLogSection section;
  int local_9c;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  string iterationDescription;
  PointTestInstance *this_local;
  
  local_9c = this->m_iteration + 1;
  iterationDescription.field_2._8_8_ = this;
  de::toString<int>(&local_98,&local_9c);
  std::operator+(&local_78,"Test iteration ",&local_98);
  std::operator+(&local_58,&local_78," / ");
  de::toString<int>((string *)&section,&this->m_iterationCount);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  pTVar2 = Context::getTestContext
                     ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
  pTVar3 = tcu::TestContext::getLog(pTVar2);
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&stack0xffffffffffffff28,pTVar3,(string *)local_38,
             (string *)local_38);
  (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[4])();
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  resultImage.m_pixels.m_cap._4_4_ = extraout_XMM0_Da;
  tcu::Surface::Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,width,width);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &points.
              super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
  vector((vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
          *)&args.blueBits);
  if (this->m_maxPointSize < resultImage.m_pixels.m_cap._4_4_) {
    pTVar2 = Context::getTestContext
                       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
    pTVar3 = tcu::TestContext::getLog(pTVar2);
    tcu::TestLog::operator<<(&local_2e8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_2e8,(char (*) [12])"Point size ");
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(float *)((long)&resultImage.m_pixels.m_cap + 4));
    pMVar5 = tcu::MessageBuilder::operator<<
                       (pMVar5,(char (*) [36])" not supported, skipping iteration.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2e8);
  }
  else {
    (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[7])
              (this,(ulong)(uint)this->m_iteration,
               &points.
                super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    BaseRenderingTestInstance::drawPrimitives
              (&this->super_BaseRenderingTestInstance,
               (Surface *)
               &drawBuffer.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &points.
                super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,VK_PRIMITIVE_TOPOLOGY_POINT_LIST)
    ;
    tcu::PointSceneSpec::PointSceneSpec((PointSceneSpec *)(colorBits.m_data + 2));
    format = BaseRenderingTestInstance::getTextureFormat(&this->super_BaseRenderingTestInstance);
    tcu::getTextureFormatBitDepth((tcu *)local_168,format);
    scene.points.
    super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (uint)((this->super_BaseRenderingTestInstance).m_multisampling != 0);
    scene.points.
    super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         (this->super_BaseRenderingTestInstance).m_subpixelBits;
    piVar4 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_168,0);
    args.numSamples = *piVar4;
    piVar4 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_168,1);
    args.subpixelBits = *piVar4;
    piVar4 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_168,2);
    args.redBits = *piVar4;
    std::vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
    swap((vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
          *)(colorBits.m_data + 2),
         (vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
          *)&args.blueBits);
    pTVar2 = Context::getTestContext
                       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context);
    pTVar3 = tcu::TestContext::getLog(pTVar2);
    args.greenBits._3_1_ =
         tcu::verifyPointGroupRasterization
                   ((Surface *)
                    &drawBuffer.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (PointSceneSpec *)(colorBits.m_data + 2),
                    (RasterizationArguments *)
                    &scene.points.
                     super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,pTVar3);
    if (!(bool)args.greenBits._3_1_) {
      this->m_allIterationsPassed = false;
    }
    tcu::PointSceneSpec::~PointSceneSpec((PointSceneSpec *)(colorBits.m_data + 2));
  }
  iVar1 = this->m_iteration + 1;
  this->m_iteration = iVar1;
  if (iVar1 == this->m_iterationCount) {
    if ((this->m_allIterationsPassed & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,"Incorrect rasterization",&local_331);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      std::allocator<char>::~allocator(&local_331);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"Pass",&local_309);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_308);
      std::__cxx11::string::~string((string *)&local_308);
      std::allocator<char>::~allocator(&local_309);
    }
  }
  else {
    tcu::TestStatus::incomplete();
  }
  local_310 = 1;
  std::vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>::
  ~vector((vector<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
           *)&args.blueBits);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
             &points.
              super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::Surface::~Surface
            ((Surface *)
             &drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&stack0xffffffffffffff28);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus PointTestInstance::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_context.getTestContext().getLog(), iterationDescription, iterationDescription);
	const float								pointSize				= getPointSize();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<PointSceneSpec::ScenePoint>	points;

	// supported?
	if (pointSize <= m_maxPointSize)
	{
		// gen data
		generatePoints(m_iteration, drawBuffer, points);

		// draw image
		drawPrimitives(resultImage, drawBuffer, VK_PRIMITIVE_TOPOLOGY_POINT_LIST);

		// compare
		{
			bool					compareOk;
			RasterizationArguments	args;
			PointSceneSpec			scene;

			tcu::IVec4				colorBits = tcu::getTextureFormatBitDepth(getTextureFormat());

			args.numSamples		= m_multisampling ? 1 : 0;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= colorBits[0];
			args.greenBits		= colorBits[1];
			args.blueBits		= colorBits[2];

			scene.points.swap(points);

			compareOk = verifyPointGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog());

			if (!compareOk)
				m_allIterationsPassed = false;
		}
	}
	else
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Point size " << pointSize << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Incorrect rasterization");
	}
	else
		return tcu::TestStatus::incomplete();
}